

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Totals * __thiscall Catch::Runner::runTests(Totals *__return_storage_ptr__,Runner *this)

{
  size_t groupIndex;
  size_t sVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  allocator local_2d1;
  vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> filterGroups;
  string local_2b0;
  size_t local_290;
  RunContext context;
  
  std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::vector
            (&filterGroups,&((this->m_config).m_p)->m_filterSets);
  if (filterGroups.
      super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
      super__Vector_impl_data._M_start ==
      filterGroups.
      super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&local_2b0,"",&local_2d1);
    TestCaseFilters::TestCaseFilters((TestCaseFilters *)&context,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::push_back
              (&filterGroups,(value_type *)&context);
    TestCaseFilters::~TestCaseFilters((TestCaseFilters *)&context);
  }
  local_2b0._M_dataplus._M_p = (pointer)(this->m_config).m_p;
  if ((Config *)local_2b0._M_dataplus._M_p != (Config *)0x0) {
    (*(((Config *)local_2b0._M_dataplus._M_p)->super_SharedImpl<Catch::IConfig>).super_IConfig.
      super_IShared.super_NonCopyable._vptr_NonCopyable[2])();
  }
  RunContext::RunContext(&context,(Ptr<const_Catch::IConfig> *)&local_2b0,&this->m_reporter);
  Ptr<const_Catch::IConfig>::~Ptr((Ptr<const_Catch::IConfig> *)&local_2b0);
  (__return_storage_ptr__->testCases).passed = 0;
  (__return_storage_ptr__->testCases).failed = 0;
  (__return_storage_ptr__->assertions).passed = 0;
  (__return_storage_ptr__->assertions).failed = 0;
  lVar3 = 0x48;
  uVar4 = 0;
  while (sVar1 = context.m_totals.assertions.failed,
        uVar4 < (ulong)(((long)filterGroups.
                               super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)filterGroups.
                              super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x68)) {
    local_290 = uVar4;
    iVar2 = (*((context.m_config.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[10])();
    groupIndex = local_290;
    if (sVar1 == (long)iVar2) break;
    std::__cxx11::string::string
              ((string *)&local_2b0,
               (string *)
               ((long)&((filterGroups.
                         super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_tagExpressions).
                       super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar3));
    RunContext::testGroupStarting
              (&context,&local_2b0,groupIndex,
               ((long)filterGroups.
                      super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)filterGroups.
                     super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x68);
    std::__cxx11::string::~string((string *)&local_2b0);
    runTestsForGroup((Totals *)&local_2b0,this,&context,
                     (TestCaseFilters *)
                     ((long)filterGroups.
                            super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar3 + -0x48));
    Totals::operator+=(__return_storage_ptr__,(Totals *)&local_2b0);
    std::__cxx11::string::string
              ((string *)&local_2b0,
               (string *)
               ((long)&((filterGroups.
                         super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_tagExpressions).
                       super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar3));
    RunContext::testGroupEnded
              (&context,&local_2b0,__return_storage_ptr__,groupIndex,
               ((long)filterGroups.
                      super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)filterGroups.
                     super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x68);
    std::__cxx11::string::~string((string *)&local_2b0);
    lVar3 = lVar3 + 0x68;
    uVar4 = groupIndex + 1;
  }
  RunContext::~RunContext(&context);
  std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::~vector
            (&filterGroups);
  return __return_storage_ptr__;
}

Assistant:

Totals runTests() {

            std::vector<TestCaseFilters> filterGroups = m_config->filters();
            if( filterGroups.empty() ) {
                TestCaseFilters filterGroup( "" );
                filterGroups.push_back( filterGroup );
            }

            RunContext context( m_config.get(), m_reporter );

            Totals totals;

            for( std::size_t i=0; i < filterGroups.size() && !context.aborting(); ++i ) {
                context.testGroupStarting( filterGroups[i].getName(), i, filterGroups.size() );
                totals += runTestsForGroup( context, filterGroups[i] );
                context.testGroupEnded( filterGroups[i].getName(), totals, i, filterGroups.size() );
            }
            return totals;
        }